

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger closure_getinfos(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClosure *pSVar3;
  SQSharedState *pSVar4;
  SQFunctionProto *pSVar5;
  SQInteger nsize;
  SQDelegable *pSVar6;
  SQObjectPtr *pSVar7;
  SQObjectValue SVar8;
  SQObjectValue this;
  long lVar9;
  long lVar10;
  long nsize_00;
  SQClass *pSVar11;
  SQObjectPtr params;
  SQObjectPtr defparams;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectValue local_40;
  HSQUIRRELVM local_38;
  
  pSVar7 = SQVM::GetAt(v,v->_stackbase);
  SVar2 = (pSVar7->super_SQObject)._type;
  pSVar3 = (pSVar7->super_SQObject)._unVal.pClosure;
  pSVar4 = v->_sharedstate;
  SVar8.pUserPointer = sq_vm_malloc(0x58);
  SQTable::SQTable(SVar8.pTable,pSVar4,4);
  ((SVar8.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  if (SVar2 == OT_CLOSURE) {
    pSVar5 = pSVar3->_function;
    nsize_00 = (pSVar5->_nparameters + 1) - (ulong)(pSVar5->_varparams == 0);
    pSVar4 = v->_sharedstate;
    local_40.pUserPointer = SVar8.pUserPointer;
    SVar8.pUserPointer = sq_vm_malloc(0x48);
    SQArray::SQArray(SVar8.pArray,pSVar4,nsize_00);
    local_70.super_SQObject._type = OT_ARRAY;
    pSVar1 = &((SVar8.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar4 = v->_sharedstate;
    nsize = pSVar5->_ndefaultparams;
    local_70.super_SQObject._unVal.pUserPointer = SVar8.pUserPointer;
    local_38 = v;
    SVar8.pUserPointer = sq_vm_malloc(0x48);
    SQArray::SQArray(SVar8.pArray,pSVar4,nsize);
    local_60.super_SQObject._type = OT_ARRAY;
    pSVar1 = &((SVar8.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_60.super_SQObject._unVal.pUserPointer = SVar8.pUserPointer;
    if (0 < pSVar5->_nparameters) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        SQArray::Set(local_70.super_SQObject._unVal.pArray,lVar9,
                     (SQObjectPtr *)((long)&(pSVar5->_parameters->super_SQObject)._type + lVar10));
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < pSVar5->_nparameters);
    }
    if (0 < pSVar5->_ndefaultparams) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        SQArray::Set(local_60.super_SQObject._unVal.pArray,lVar9,
                     (SQObjectPtr *)((long)&(pSVar3->_defaultparams->super_SQObject)._type + lVar10)
                    );
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < pSVar5->_ndefaultparams);
    }
    v = local_38;
    SVar8 = local_70.super_SQObject._unVal;
    if (pSVar5->_varparams != 0) {
      local_80.super_SQObject._unVal.pString = SQString::Create(local_38->_sharedstate,"...",-1);
      local_80.super_SQObject._type = OT_STRING;
      if (local_80.super_SQObject._unVal.pTable == (SQTable *)0x0) goto LAB_001173f2;
      pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQArray::Set(SVar8.pArray,nsize_00 + -1,&local_80);
      SQObjectPtr::~SQObjectPtr(&local_80);
    }
    local_80.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"native",-1);
    SVar8 = local_40;
    local_80.super_SQObject._type = OT_STRING;
    if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
      pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_50.super_SQObject._type = OT_BOOL;
      local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
      SQTable::NewSlot(local_40.pTable,&local_80,&local_50);
      SQObjectPtr::~SQObjectPtr(&local_50);
      SQObjectPtr::~SQObjectPtr(&local_80);
      local_80.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"name",-1);
      local_80.super_SQObject._type = OT_STRING;
      if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
        pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        SQTable::NewSlot(SVar8.pTable,&local_80,&pSVar5->_name);
        SQObjectPtr::~SQObjectPtr(&local_80);
        local_80.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"src",-1);
        local_80.super_SQObject._type = OT_STRING;
        if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
          pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          SQTable::NewSlot(SVar8.pTable,&local_80,&pSVar5->_sourcename);
          SQObjectPtr::~SQObjectPtr(&local_80);
          local_80.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"parameters",-1)
          ;
          local_80.super_SQObject._type = OT_STRING;
          if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
            pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            SQTable::NewSlot(SVar8.pTable,&local_80,&local_70);
            SQObjectPtr::~SQObjectPtr(&local_80);
            local_80.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"varargs",-1);
            local_80.super_SQObject._type = OT_STRING;
            if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
              pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
              local_50.super_SQObject._unVal = (SQObjectValue)pSVar5->_varparams;
              local_50.super_SQObject._type = OT_INTEGER;
              SQTable::NewSlot(SVar8.pTable,&local_80,&local_50);
              SQObjectPtr::~SQObjectPtr(&local_50);
              SQObjectPtr::~SQObjectPtr(&local_80);
              local_80.super_SQObject._unVal.pString =
                   SQString::Create(v->_sharedstate,"defparams",-1);
              local_80.super_SQObject._type = OT_STRING;
              if (local_80.super_SQObject._unVal.pTable != (SQTable *)0x0) {
                pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).
                          super_SQCollectable.super_SQRefCounted._uiRef;
                *pSVar1 = *pSVar1 + 1;
                SQTable::NewSlot(SVar8.pTable,&local_80,&local_60);
                SQObjectPtr::~SQObjectPtr(&local_80);
                goto LAB_001173a5;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_70.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"native",-1);
    local_70.super_SQObject._type = OT_STRING;
    if (local_70.super_SQObject._unVal.pTable != (SQTable *)0x0) {
      pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_60.super_SQObject._type = OT_BOOL;
      local_60.super_SQObject._unVal.nInteger = 1;
      SQTable::NewSlot(SVar8.pTable,&local_70,&local_60);
      SQObjectPtr::~SQObjectPtr(&local_60);
      SQObjectPtr::~SQObjectPtr(&local_70);
      local_70.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"name",-1);
      local_70.super_SQObject._type = OT_STRING;
      if (local_70.super_SQObject._unVal.pTable != (SQTable *)0x0) {
        pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        SQTable::NewSlot(SVar8.pTable,&local_70,
                         (SQObjectPtr *)&pSVar3[1].super_SQCollectable.super_SQRefCounted._weakref);
        SQObjectPtr::~SQObjectPtr(&local_70);
        local_70.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"paramscheck",-1);
        local_70.super_SQObject._type = OT_STRING;
        if (local_70.super_SQObject._unVal.pTable != (SQTable *)0x0) {
          pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          local_60.super_SQObject._unVal = (SQObjectValue)pSVar3->_env;
          local_60.super_SQObject._type = OT_INTEGER;
          SQTable::NewSlot(SVar8.pTable,&local_70,&local_60);
          SQObjectPtr::~SQObjectPtr(&local_60);
          SQObjectPtr::~SQObjectPtr(&local_70);
          local_70.super_SQObject._type = OT_NULL;
          local_70.super_SQObject._unVal.pTable = (SQTable *)0x0;
          pSVar11 = pSVar3->_base;
          if (pSVar11 != (SQClass *)0x0) {
            pSVar4 = v->_sharedstate;
            this.pUserPointer = sq_vm_malloc(0x48);
            SQArray::SQArray(this.pArray,pSVar4,(SQInteger)pSVar11);
            SVar2 = local_70.super_SQObject._type;
            local_70.super_SQObject._type = OT_ARRAY;
            pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _uiRef;
            *pSVar1 = *pSVar1 + 1;
            if ((SVar2 >> 0x1b & 1) != 0) {
              pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                pSVar6 = &(local_70.super_SQObject._unVal.pTable)->super_SQDelegable;
                local_70.super_SQObject._unVal.pUserPointer = this.pUserPointer;
                (*(pSVar6->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
                this = local_70.super_SQObject._unVal;
              }
            }
            local_70.super_SQObject._unVal = this;
            if (pSVar3->_base != (SQClass *)0x0) {
              pSVar11 = (SQClass *)0x0;
              do {
                local_60.super_SQObject._unVal =
                     *(SQObjectValue *)
                      (&(pSVar3->_root->super_SQRefCounted)._vptr_SQRefCounted + (long)pSVar11);
                local_60.super_SQObject._type = OT_INTEGER;
                SQArray::Set(local_70.super_SQObject._unVal.pArray,(SQInteger)pSVar11,&local_60);
                SQObjectPtr::~SQObjectPtr(&local_60);
                pSVar11 = (SQClass *)
                          ((long)&(pSVar11->super_SQCollectable).super_SQRefCounted.
                                  _vptr_SQRefCounted + 1);
              } while (pSVar11 < pSVar3->_base);
            }
          }
          local_60.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,"typecheck",-1);
          local_60.super_SQObject._type = OT_STRING;
          if (local_60.super_SQObject._unVal.pTable != (SQTable *)0x0) {
            pSVar1 = &((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            SQTable::NewSlot(SVar8.pTable,&local_60,&local_70);
LAB_001173a5:
            SQObjectPtr::~SQObjectPtr(&local_60);
            SQObjectPtr::~SQObjectPtr(&local_70);
            local_70.super_SQObject._type = OT_TABLE;
            pSVar1 = &((SVar8.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _uiRef;
            *pSVar1 = *pSVar1 + 1;
            local_70.super_SQObject._unVal = SVar8;
            SQVM::Push(v,&local_70);
            SQObjectPtr::~SQObjectPtr(&local_70);
            return 1;
          }
        }
      }
    }
  }
LAB_001173f2:
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                ,0xea,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

static SQInteger closure_getinfos(HSQUIRRELVM v) {
    SQObject o = stack_get(v,1);
    SQTable *res = SQTable::Create(_ss(v),4);
    if(type(o) == OT_CLOSURE) {
        SQFunctionProto *f = _closure(o)->_function;
        SQInteger nparams = f->_nparameters + (f->_varparams?1:0);
        SQObjectPtr params = SQArray::Create(_ss(v),nparams);
    SQObjectPtr defparams = SQArray::Create(_ss(v),f->_ndefaultparams);
        for(SQInteger n = 0; n<f->_nparameters; n++) {
            _array(params)->Set((SQInteger)n,f->_parameters[n]);
        }
    for(SQInteger j = 0; j<f->_ndefaultparams; j++) {
            _array(defparams)->Set((SQInteger)j,_closure(o)->_defaultparams[j]);
        }
        if(f->_varparams) {
            _array(params)->Set(nparams-1,SQString::Create(_ss(v),_SC("..."),-1));
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),false);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),f->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("src"),-1),f->_sourcename);
        res->NewSlot(SQString::Create(_ss(v),_SC("parameters"),-1),params);
        res->NewSlot(SQString::Create(_ss(v),_SC("varargs"),-1),f->_varparams);
    res->NewSlot(SQString::Create(_ss(v),_SC("defparams"),-1),defparams);
    }
    else { //OT_NATIVECLOSURE
        SQNativeClosure *nc = _nativeclosure(o);
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),true);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),nc->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("paramscheck"),-1),nc->_nparamscheck);
        SQObjectPtr typecheck;
        if(nc->_typecheck.size() > 0) {
            typecheck =
                SQArray::Create(_ss(v), nc->_typecheck.size());
            for(SQUnsignedInteger n = 0; n<nc->_typecheck.size(); n++) {
                    _array(typecheck)->Set((SQInteger)n,nc->_typecheck[n]);
            }
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("typecheck"),-1),typecheck);
    }
    v->Push(res);
    return 1;
}